

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>
capnp::readMessage(AsyncInputStream *input,ReaderOptions options,ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  AsyncMessageReader *pAVar2;
  void *pvVar3;
  SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:193:23)>
  *location;
  Promise<bool> promise;
  void *continuationTracePtr;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  undefined1 local_78 [24];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  code *local_58;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  ReaderOptions local_38;
  
  local_38.traversalLimitInWords = options._8_8_;
  local_38.nestingLimit = (int)scratchSpace.ptr;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((kj *)&local_50,&local_38);
  pAVar2 = local_50.ptr;
  anon_unknown_0::AsyncMessageReader::read
            ((AsyncMessageReader *)local_78,(int)local_50.ptr,(void *)options.traversalLimitInWords,
             scratchSpace.size_);
  local_78._8_8_ = local_50.disposer;
  local_50.ptr = (AsyncMessageReader *)0x0;
  local_78._16_8_ = pAVar2;
  local_58 = kj::_::
             SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:193:23)>
             ::anon_class_16_1_69694a01_for_func::operator();
  pPVar1 = ((PromiseArenaMember *)local_78._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_78._0_8_ - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:193:23)>
                *)((long)pvVar3 + 0x3d0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<bool,capnp::readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_78,
               (anon_class_16_1_69694a01_for_func *)(local_78 + 8),&local_58);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((PromiseArenaMember *)local_78._0_8_)->arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<bool,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:193:23)>
                *)(local_78._0_8_ + -0x30);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<bool,capnp::readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_78,
               (anon_class_16_1_69694a01_for_func *)(local_78 + 8),&local_58);
    (((PromiseNode *)(local_78._0_8_ + -0x30))->super_PromiseArenaMember).arena = pPVar1;
  }
  local_60.ptr = (PromiseNode *)0x0;
  input->_vptr_AsyncInputStream = (_func_int **)location;
  local_40.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own
            ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)(local_78 + 8)
            );
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_78);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own(&local_50);
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Own<MessageReader>> readMessage(
    kj::AsyncInputStream& input, ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->read(input, scratchSpace);
  return promise.then([reader = kj::mv(reader)](bool success) mutable -> kj::Own<MessageReader> {
    if (!success) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
    }
    return kj::mv(reader);
  });
}